

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeanUpdater_impl.hpp
# Opt level: O0

void __thiscall
hiberlite::UpdateBean::
act<hiberlite::AVisitor<hiberlite::UpdateBean>,double,hiberlite::stl_stream_adapter<double,std::set<double,std::less<double>,std::allocator<double>>>>
          (UpdateBean *this,AVisitor<hiberlite::UpdateBean> *av,
          collection_nvp<double,_hiberlite::stl_stream_adapter<double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>
          *nvp)

{
  undefined8 rowid;
  sqlid_t _value;
  collection_nvp<double,_hiberlite::stl_stream_adapter<double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>
  *this_00;
  bool bVar1;
  _Map_pointer ppSVar2;
  RowScope *pRVar3;
  undefined1 local_218 [95];
  allocator local_1b9;
  string local_1b8 [39];
  allocator local_191;
  string local_190 [32];
  undefined1 local_170 [8];
  sql_nvp<double> el_nvp;
  string local_108 [32];
  undefined1 local_e8 [24];
  sqlid_t entry_id;
  double *el;
  undefined1 local_80 [8];
  string tab;
  string local_50 [32];
  shared_cnt_obj_pair<hiberlite::autoclosed_con> *local_30;
  stl_stream_adapter<double,_std::set<double,_std::less<double>,_std::allocator<double>_>_> *stream;
  sqlid_t index;
  collection_nvp<double,_hiberlite::stl_stream_adapter<double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>
  *nvp_local;
  AVisitor<hiberlite::UpdateBean> *av_local;
  UpdateBean *this_local;
  
  stream = (stl_stream_adapter<double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>
            *)0x0;
  local_30 = (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)&nvp->stream;
  index = (sqlid_t)nvp;
  nvp_local = (collection_nvp<double,_hiberlite::stl_stream_adapter<double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>
               *)av;
  av_local = (AVisitor<hiberlite::UpdateBean> *)this;
  std::__cxx11::string::string(local_50,(string *)nvp);
  AVisitor<hiberlite::UpdateBean>::diveTable(av,(string *)local_50);
  std::__cxx11::string::~string(local_50);
  AVisitor<hiberlite::UpdateBean>::getScope
            ((Scope *)&el,(AVisitor<hiberlite::UpdateBean> *)nvp_local);
  Scope::table_abi_cxx11_((Scope *)local_80);
  Scope::~Scope((Scope *)&el);
  while( true ) {
    bVar1 = stl_stream_adapter<double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>
            ::done((stl_stream_adapter<double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>
                    *)local_30);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    entry_id = (sqlid_t)stl_stream_adapter<double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>
                        ::getNext((stl_stream_adapter<double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>
                                   *)local_30);
    AVisitor<hiberlite::UpdateBean>::getConnection((AVisitor<hiberlite::UpdateBean> *)local_e8);
    std::__cxx11::string::string(local_108,(string *)local_80);
    ppSVar2 = (_Map_pointer)Database::allocId((shared_connection *)local_e8,(string *)local_108);
    std::__cxx11::string::~string(local_108);
    shared_res<hiberlite::autoclosed_con>::~shared_res
              ((shared_res<hiberlite::autoclosed_con> *)local_e8);
    local_e8._16_8_ = ppSVar2;
    std::__cxx11::string::string((string *)&el_nvp.field_0x40,(string *)local_80);
    rowid = local_e8._16_8_;
    pRVar3 = curRow(this);
    startRow(this,(string *)&el_nvp.field_0x40,rowid,pRVar3->id,(sqlid_t)stream);
    std::__cxx11::string::~string((string *)&el_nvp.field_0x40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_190,"item",&local_191);
    _value = entry_id;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b8,"",&local_1b9);
    sql_nvp<double>::sql_nvp
              ((sql_nvp<double> *)local_170,(string *)local_190,(double *)_value,(string *)local_1b8
              );
    std::__cxx11::string::~string(local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
    std::__cxx11::string::~string(local_190);
    std::allocator<char>::~allocator((allocator<char> *)&local_191);
    this_00 = nvp_local;
    sql_nvp<double>::sql_nvp((sql_nvp<double> *)(local_218 + 0x10),(sql_nvp<double> *)local_170);
    AVisitor<hiberlite::UpdateBean>::operator&
              ((AVisitor<hiberlite::UpdateBean> *)this_00,(sql_nvp<double> *)(local_218 + 0x10));
    sql_nvp<double>::~sql_nvp((sql_nvp<double> *)(local_218 + 0x10));
    AVisitor<hiberlite::UpdateBean>::getConnection((AVisitor<hiberlite::UpdateBean> *)local_218);
    commitRow(this,(shared_connection *)local_218,local_e8._16_8_);
    shared_res<hiberlite::autoclosed_con>::~shared_res
              ((shared_res<hiberlite::autoclosed_con> *)local_218);
    stream = (stl_stream_adapter<double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>
              *)((long)&stream->ct + 1);
    sql_nvp<double>::~sql_nvp((sql_nvp<double> *)local_170);
  }
  AVisitor<hiberlite::UpdateBean>::pop((AVisitor<hiberlite::UpdateBean> *)nvp_local);
  std::__cxx11::string::~string((string *)local_80);
  return;
}

Assistant:

void UpdateBean::act(AV& av, collection_nvp<E,S> nvp ){

	sqlid_t index=0;
	S& stream=nvp.stream;

	av.diveTable(nvp.name);
		std::string tab=av.getScope().table();
		while(!stream.done()){
			E& el=stream.getNext();
				sqlid_t entry_id=Database::allocId(av.getConnection(), tab);

				startRow(tab,entry_id, curRow()->id,index);
					sql_nvp<E> el_nvp("item",el);
					av & el_nvp;
				commitRow(av.getConnection(), entry_id);
			index++;
		}
	av.pop();
}